

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngvalid.c
# Opt level: O0

void gama_modification_init(gama_modification *me,png_modifier *pm,double gammad)

{
  png_fixed_point pVar1;
  double g;
  double gammad_local;
  png_modifier *pm_local;
  gama_modification *me_local;
  
  modification_init(&me->this);
  (me->this).chunk = 0x67414d41;
  (me->this).modify_fn = gama_modify;
  (me->this).add = 0x504c5445;
  pVar1 = fix(gammad);
  me->gamma = (int)(double)pVar1;
  (me->this).next = pm->modifications;
  pm->modifications = &me->this;
  return;
}

Assistant:

static void
gama_modification_init(gama_modification *me, png_modifier *pm, double gammad)
{
   double g;

   modification_init(&me->this);
   me->this.chunk = CHUNK_gAMA;
   me->this.modify_fn = gama_modify;
   me->this.add = CHUNK_PLTE;
   g = fix(gammad);
   me->gamma = (png_fixed_point)g;
   me->this.next = pm->modifications;
   pm->modifications = &me->this;
}